

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient-hostkey-cache.c
# Opt level: O3

_Bool ssh_transient_hostkey_cache_verify(ssh_transient_hostkey_cache *thc,ssh_key *key)

{
  int iVar1;
  void *pvVar2;
  strbuf *buf_o;
  _Bool _Var3;
  
  pvVar2 = find234(thc->cache,key->vt,ssh_transient_hostkey_cache_find);
  if (pvVar2 == (void *)0x0) {
    _Var3 = false;
  }
  else {
    buf_o = strbuf_new();
    (*key->vt->public_blob)(key,buf_o->binarysink_);
    if (buf_o->len == (*(undefined8 **)((long)pvVar2 + 8))[2]) {
      iVar1 = bcmp(buf_o->s,(void *)**(undefined8 **)((long)pvVar2 + 8),buf_o->len);
      _Var3 = iVar1 == 0;
    }
    else {
      _Var3 = false;
    }
    strbuf_free(buf_o);
  }
  return _Var3;
}

Assistant:

bool ssh_transient_hostkey_cache_verify(
    ssh_transient_hostkey_cache *thc, ssh_key *key)
{
    struct ssh_transient_hostkey_cache_entry *ent;
    bool toret = false;

    if ((ent = find234(thc->cache, (void *)ssh_key_alg(key),
                       ssh_transient_hostkey_cache_find)) != NULL) {
        strbuf *this_blob = strbuf_new();
        ssh_key_public_blob(key, BinarySink_UPCAST(this_blob));

        if (this_blob->len == ent->pub_blob->len &&
            !memcmp(this_blob->s, ent->pub_blob->s,
                    this_blob->len))
            toret = true;

        strbuf_free(this_blob);
    }

    return toret;
}